

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::EnumNextPrevMethod::EnumNextPrevMethod
          (EnumNextPrevMethod *this,KnownSystemName knownNameId,bool next)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__EnumNextPrevMethod_00dda180;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

EnumNextPrevMethod(KnownSystemName knownNameId, bool next) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), next(next) {}